

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSourceFile.cxx
# Opt level: O0

void __thiscall cmSourceFile::CheckLanguage(cmSourceFile *this,string *ext)

{
  cmMakefile *this_00;
  cmGlobalGenerator *this_01;
  char *ext_00;
  ulong uVar1;
  undefined1 local_48 [8];
  string l;
  cmGlobalGenerator *gg;
  cmMakefile *mf;
  string *ext_local;
  cmSourceFile *this_local;
  
  this_00 = cmSourceFileLocation::GetMakefile(&this->Location);
  this_01 = cmMakefile::GetGlobalGenerator(this_00);
  l.field_2._8_8_ = this_01;
  ext_00 = (char *)std::__cxx11::string::c_str();
  cmGlobalGenerator::GetLanguageFromExtension_abi_cxx11_((string *)local_48,this_01,ext_00);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    std::__cxx11::string::operator=((string *)&this->Language,(string *)local_48);
  }
  std::__cxx11::string::~string((string *)local_48);
  return;
}

Assistant:

void cmSourceFile::CheckLanguage(std::string const& ext)
{
  // Try to identify the source file language from the extension.
  cmMakefile const* mf = this->Location.GetMakefile();
  cmGlobalGenerator* gg = mf->GetGlobalGenerator();
  std::string l = gg->GetLanguageFromExtension(ext.c_str());
  if (!l.empty()) {
    this->Language = l;
  }
}